

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_score.cc
# Opt level: O0

void __thiscall
xLearn::LinearScore::CalcGrad(LinearScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  int iVar1;
  ostream *poVar2;
  long in_RDI;
  LogSeverity in_XMM0_Da;
  Model *unaff_retaddr;
  SparseRow *in_stack_00000008;
  LinearScore *in_stack_00000010;
  allocator *this_00;
  allocator local_81;
  string local_80 [8];
  real_t in_stack_ffffffffffffff88;
  real_t in_stack_ffffffffffffff8c;
  Model *in_stack_ffffffffffffff90;
  SparseRow *in_stack_ffffffffffffff98;
  LinearScore *in_stack_ffffffffffffffa0;
  real_t in_stack_ffffffffffffffa8;
  real_t in_stack_ffffffffffffffac;
  Model *in_stack_ffffffffffffffb0;
  SparseRow *in_stack_ffffffffffffffb8;
  LinearScore *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  string *in_stack_ffffffffffffffd8;
  long lVar3;
  
  lVar3 = in_RDI;
  iVar1 = std::__cxx11::string::compare((char *)(in_RDI + 0x20));
  if (iVar1 == 0) {
    calc_grad_sgd(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                  in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)(in_RDI + 0x20));
    if (iVar1 == 0) {
      calc_grad_adagrad(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                        in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                        in_stack_ffffffffffffffa8);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)(in_RDI + 0x20));
      if (iVar1 == 0) {
        calc_grad_ftrl(in_stack_00000010,in_stack_00000008,unaff_retaddr,
                       (real_t)((ulong)lVar3 >> 0x20),(real_t)lVar3);
      }
      else {
        Logger::Logger((Logger *)&stack0xffffffffffffffdc,FATAL);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffffb8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/score/linear_score.cc"
                   ,(allocator *)&stack0xffffffffffffffb7);
        this_00 = &local_81;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_80,"CalcGrad",this_00);
        poVar2 = Logger::Start(in_XMM0_Da,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                               in_stack_ffffffffffffffc8);
        poVar2 = std::operator<<(poVar2,"Unknow optimization method: ");
        std::operator<<(poVar2,(string *)(in_RDI + 0x20));
        std::__cxx11::string::~string(local_80);
        std::allocator<char>::~allocator((allocator<char> *)&local_81);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
        Logger::~Logger((Logger *)this_00);
      }
    }
  }
  return;
}

Assistant:

void LinearScore::CalcGrad(const SparseRow* row,
                           Model& model,
                           real_t pg,
                           real_t norm) {
  // Using sgd
  if (opt_type_.compare("sgd") == 0) {
    this->calc_grad_sgd(row, model, pg, norm);
  }
  // Using adagrad
  else if (opt_type_.compare("adagrad") == 0) {
    this->calc_grad_adagrad(row, model, pg, norm);
  }
  // Using ftrl
  else if (opt_type_.compare("ftrl") == 0) {
    this->calc_grad_ftrl(row, model, pg, norm);
  }
  else {
    LOG(FATAL) << "Unknow optimization method: " << opt_type_;
  }
}